

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O2

string * __thiscall
libtorrent::aux::torrent::resolve_filename_abi_cxx11_
          (string *__return_storage_ptr__,torrent *this,file_index_t file)

{
  allocator<char> *__a;
  char *__s;
  allocator<char> local_d;
  allocator<char> local_c;
  allocator<char> local_b;
  allocator<char> local_a;
  allocator<char> local_9;
  
  switch(file.m_val) {
  case -6:
    __s = "partfile";
    __a = &local_c;
    break;
  case -5:
    __s = "exception";
    __a = &local_b;
    break;
  case -4:
    __s = "metadata";
    __a = &local_d;
    break;
  case -3:
    __s = "SSL Context";
    __a = &local_a;
    break;
  default:
    if ((-1 < file.m_val) && ((this->m_storage).m_disk_io != (disk_interface *)0x0)) {
      file_storage::file_path
                (__return_storage_ptr__,
                 &((this->super_torrent_hot_members).m_torrent_file.
                   super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                  ->m_files,file,&this->m_save_path);
      return __return_storage_ptr__;
    }
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->m_save_path);
    return __return_storage_ptr__;
  case -1:
    __s = "";
    __a = &local_9;
  }
  ::std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,__s,__a);
  return __return_storage_ptr__;
}

Assistant:

std::string torrent::resolve_filename(file_index_t const file) const
	{
		if (file == torrent_status::error_file_none) return "";
		if (file == torrent_status::error_file_ssl_ctx) return "SSL Context";
		if (file == torrent_status::error_file_exception) return "exception";
		if (file == torrent_status::error_file_partfile) return "partfile";
		if (file == torrent_status::error_file_metadata) return "metadata";

		if (m_storage && file >= file_index_t(0))
		{
			file_storage const& st = m_torrent_file->files();
			return st.file_path(file, m_save_path);
		}
		else
		{
			return m_save_path;
		}
	}